

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

string * skiwi::(anonymous_namespace)::uint64_to_hex_abi_cxx11_(uint64_t i)

{
  string *in_RDI;
  long lVar1;
  string hex;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"0x","");
  lVar1 = 8;
  do {
    local_50 = 0;
    local_48 = 0;
    local_58 = &local_48;
    std::__cxx11::string::push_back((char)&local_58);
    std::__cxx11::string::push_back((char)&local_58);
    std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    lVar1 = lVar1 + -1;
  } while (lVar1 != 0);
  return in_RDI;
}

Assistant:

std::string uint64_to_hex(uint64_t i)
    {
    unsigned char* ptr = (unsigned char*)&i;
    std::string out = "0x";
    for (int j = 7; j >= 0; --j)
      out += uchar_to_hex(ptr[j]);
    return out;
    }